

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall WorkSpace::list_distance_graphs_abi_cxx11_(WorkSpace *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  DistanceGraph *d;
  iterator __end1;
  iterator __begin1;
  vector<DistanceGraph,_std::allocator<DistanceGraph>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  vector<DistanceGraph,_std::allocator<DistanceGraph>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  __normal_iterator<DistanceGraph_*,_std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>_>
  local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __args = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x440f5f);
  local_20 = in_RSI + 0xe;
  local_28._M_current =
       (DistanceGraph *)
       std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>::begin(in_stack_ffffffffffffff98);
  std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<DistanceGraph_*,_std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>_>
                             *)in_RDI,
                            (__normal_iterator<DistanceGraph_*,_std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<DistanceGraph_*,_std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>_>
    ::operator*(&local_28);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>(in_RSI,__args);
    __gnu_cxx::
    __normal_iterator<DistanceGraph_*,_std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>_>
    ::operator++(&local_28);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)__args;
}

Assistant:

std::vector<std::string> WorkSpace::list_distance_graphs() {
    std::vector<std::string> names;
    for (const auto &d: distance_graphs) {
        names.emplace_back(d.name);
    }
    return names;
}